

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

int __thiscall UnifiedRegex::CharBitvec::NextSet(CharBitvec *this,int k)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  
  if ((uint)k < 0x100) {
    uVar2 = (ulong)((uint)k >> 5);
    uVar1 = k & 0x1f;
    uVar4 = this->vec[uVar2] >> (sbyte)uVar1;
    uVar3 = k + 0x20U & 0x1e0;
    iVar6 = 0;
    do {
      if (uVar4 == 0) {
        uVar3 = (k - uVar1) + 0x20;
        break;
      }
      if ((uVar4 & 1) != 0) {
        return k - iVar6;
      }
      uVar4 = uVar4 >> 1;
      iVar6 = iVar6 + -1;
    } while (uVar1 - 0x20 != iVar6);
    if ((uint)k < 0xe0) {
      do {
        uVar5 = this->vec[uVar2 + 1];
        uVar2 = uVar2 + 1;
        iVar6 = 0;
        do {
          if (uVar5 == 0) break;
          if ((uVar5 & 1) != 0) {
            return uVar3 - iVar6;
          }
          uVar5 = uVar5 >> 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != -0x20);
        uVar3 = uVar3 + 0x20;
      } while (uVar2 != 7);
    }
  }
  return -1;
}

Assistant:

int CharBitvec::NextSet(int k) const
    {
        if (k < 0 || k >= Size)
            return -1;
        uint w = k / wordSize;
        uint o = k % wordSize;
        uint32 v = vec[w] >> o;
        do
        {
            if (v == 0)
            {
                k += wordSize - o;
                break;
            }
            else if ((v & 0x1) != 0)
                return k;
            else
            {
                v >>= 1;
                o++;
                k++;
            }
        }
        while (o < wordSize);

        w++;
        while (w < vecSize)
        {
            o = 0;
            v = vec[w];
            do
            {
                if (v == 0)
                {
                    k += wordSize - o;
                    break;
                }
                else if ((v & 0x1) != 0)
                    return k;
                else
                {
                    v >>= 1;
                    o++;
                    k++;
                }

            }
            while (o < wordSize);
            w++;
        }
        return -1;
    }